

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<long_double>::Print(TPZFrontSym<long_double> *this,char *name,ostream *out)

{
  ostream *poVar1;
  longdouble *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (name != (char *)0x0) {
    poVar1 = std::operator<<(out,name);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<(out,"Frontal Matrix Size          ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Maximum Frontal Matrix Size  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_TPZFront<long_double>).fMaxFront)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"Local Indexation ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Position  ");
  poVar1 = std::operator<<(poVar1," Local index");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar5 = 0; lVar5 < (this->super_TPZFront<long_double>).fLocal.fNElements; lVar5 = lVar5 + 1)
  {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    poVar1 = std::operator<<(poVar1,"         ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"Global Indexation ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Position  ");
  poVar1 = std::operator<<(poVar1," Global index");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar5 = 0; lVar5 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements;
      lVar5 = lVar5 + 1) {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    poVar1 = std::operator<<(poVar1,"            ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"Local Freed Equatoins  ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"position ");
  poVar1 = std::operator<<(poVar1,"Local Equation ");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar5 = (this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.
          fNElements;
  lVar6 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar6;
  }
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    poVar1 = std::operator<<(poVar1,"             ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>
                               .super_TPZVec<int>.fStore[lVar6]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<(out,"Frontal Matrix ");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (0 < (this->super_TPZFront<long_double>).fData.fNElements) {
    uVar4 = 0;
    while (lVar5 = (this->super_TPZFront<long_double>).fFront, (long)uVar4 < lVar5) {
      for (uVar3 = 0; (long)uVar3 < lVar5; uVar3 = uVar3 + 1) {
        if (uVar4 < uVar3) {
          plVar2 = (longdouble *)
                   ((long)(this->super_TPZFront<long_double>).fData.fStore +
                   uVar4 * 0x10 + (uVar3 * (uVar3 + 1) & 0xfffffffffffffffe) * 8);
        }
        else {
          plVar2 = (this->super_TPZFront<long_double>).fData.fStore +
                   ((uVar4 + 1) * uVar4 >> 1) + uVar3;
        }
        poVar1 = std::ostream::_M_insert<long_double>(*plVar2);
        std::operator<<(poVar1," ");
        lVar5 = (this->super_TPZFront<long_double>).fFront;
      }
      std::endl<char,std::char_traits<char>>(out);
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::Print(const char *name, std::ostream& out) const
{
	if(name) out << name << endl;
	int64_t i,j,loop_limit;
	
	
	out <<  "Frontal Matrix Size          "<< this->fFront << endl;
	out <<  "Maximum Frontal Matrix Size  "<< this->fMaxFront << endl;
	
	out << endl;
	out <<  "Local Indexation "<< endl;
	out <<  "Position  "<<" Local index"<< endl;
	for(i=0;i<this->fLocal.NElements();i++){
		out <<   i <<  "         "  << this->fLocal[i] << endl;
	}
	
	out << endl;
	out <<  "Global Indexation "<< endl;
	out <<  "Position  "<<" Global index"<< endl;
	
	for(i=0;i<this->fGlobal.NElements();i++){
		out <<   i <<  "            "<< this->fGlobal[i] << endl;
	}
	
	out << endl;
	out <<  "Local Freed Equatoins  "<< this->fFree.NElements() << endl;
	out <<  "position "<<   "Local Equation "<<endl;
	loop_limit=this->fFree.NElements();
	for(i=0;i<loop_limit;i++){
		out <<  i <<  "             " << this->fFree[i] << endl;
	}
	out <<  "Frontal Matrix "<< endl;
	if(this->fData.NElements() > 0) {
		for(i=0;i<this->fFront;i++){
			for(j=0;j<this->fFront;j++) out << ((i<j) ? Element(i,j) : Element(j,i)) <<  " ";
			out << endl;
		}
	}
}